

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O3

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindNode(Binder *this,SetOperationNode *statement)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar1;
  SetOperationType SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> _Var4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer puVar9;
  pointer pcVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  BaseExpression *pBVar13;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> _Var14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  int iVar18;
  pointer pBVar19;
  idx_t iVar20;
  Binder *pBVar21;
  pointer pBVar22;
  type pBVar23;
  type pBVar24;
  reference pvVar25;
  iterator iVar26;
  mapped_type *pmVar27;
  pointer pbVar28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var29;
  reference pvVar30;
  reference pvVar31;
  undefined8 extraout_RAX;
  reference pvVar32;
  iterator iVar33;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var34;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  type pBVar35;
  pointer pBVar36;
  BinderException *pBVar37;
  vector<duckdb::LogicalType,_true> *pvVar38;
  QueryNode *in_RDX;
  idx_t i;
  ulong __n;
  pointer pbVar39;
  __buckets_ptr pp_Var40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type sVar41;
  undefined1 *__n_00;
  ColumnBinding binding;
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  OrderBinder order_binder;
  vector<unsigned_long,_true> right_reorder_idx;
  vector<unsigned_long,_true> left_reorder_idx;
  case_insensitive_map_t<idx_t> left_names_map;
  SelectBindState bind_state;
  case_insensitive_map_t<idx_t> right_names_map;
  _Head_base<0UL,_duckdb::BoundSetOperationNode_*,_false> local_360;
  optional_ptr<duckdb::Binder,_true> local_358;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_350;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_348;
  type local_340;
  type local_338;
  undefined8 local_330;
  type local_328;
  size_type local_320;
  QueryNode *local_318;
  vector<duckdb::LogicalType,_true> *local_310;
  vector<duckdb::LogicalType,_true> *local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_300;
  undefined1 local_2f8 [56];
  undefined1 local_2c0 [24];
  size_type local_2a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  __uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> local_258;
  vector<duckdb::LogicalType,_true> *local_250;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_248;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [32];
  undefined1 auStack_1c8 [16];
  ClientContext *local_1b8;
  __node_base local_1b0;
  __buckets_ptr pp_Stack_1a8;
  float local_1a0;
  __node_base local_198;
  undefined1 auStack_190 [8];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_188;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_170;
  undefined1 local_138 [56];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_100;
  pointer local_c8;
  pointer puStack_c0;
  __node_base local_b8;
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_b0;
  LogicalType local_98;
  LogicalType local_80;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  _Alloc_hider local_40;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> oStack_38;
  
  local_358.ptr = (Binder *)statement;
  local_258._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)this;
  local_360._M_head_impl = (BoundSetOperationNode *)operator_new(0xf8);
  *(undefined1 *)
   &(((element_type *)local_360._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = 2;
  ((element_type *)local_360._M_head_impl)->context = (ClientContext *)0x0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_bucket_count = 0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_element_count = 0;
  *(undefined8 *)
   &(((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_rehash_policy.
    _M_max_load_factor = 0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_360._M_head_impl)->CTE_bindings)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined ***)
   &(((element_type *)local_360._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__BoundSetOperationNode_0243d2b8;
  *(undefined2 *)&(((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_bucket_count = 0;
  (((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_element_count = 0;
  (((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_rehash_policy._M_next_resize = 0;
  (((element_type *)local_360._M_head_impl)->bound_ctes)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_bucket_count = 0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_element_count = 0;
  *(undefined8 *)
   &(((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_rehash_policy.
    _M_max_load_factor = 0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_rehash_policy.
  _M_next_resize = 0;
  (((element_type *)local_360._M_head_impl)->bind_context).cte_references._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).binder = (Binder *)0x0;
  *(undefined8 *)
   &(((element_type *)local_360._M_head_impl)->bind_context).bindings_list.
    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       = 0;
  (((element_type *)local_360._M_head_impl)->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).using_columns._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (((element_type *)local_360._M_head_impl)->bind_context).using_columns._M_h._M_bucket_count = 0;
  (((element_type *)local_360._M_head_impl)->bind_context).using_columns._M_h._M_before_begin._M_nxt
       = (_Hash_node_base *)0x0;
  SVar2 = *(SetOperationType *)&in_RDX[1]._vptr_QueryNode;
  local_318 = in_RDX;
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar19->setop_type = SVar2;
  bVar17 = *(bool *)((long)&local_318[1]._vptr_QueryNode + 1);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar19->setop_all = bVar17;
  iVar20 = GenerateTableIndex(local_358.ptr);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar19->setop_index = iVar20;
  CreateBinder((Binder *)local_1f8,(local_358.ptr)->context,local_358,REGULAR_BINDER);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  uVar16 = local_1f8._8_8_;
  uVar15 = local_1f8._0_8_;
  local_1f8._0_8_ = (element_type *)0x0;
  local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (pBVar19->left_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar19->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar15;
  (pBVar19->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar16;
  if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar21 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar19->left_binder);
  pBVar21->can_contain_nulls = true;
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar21 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar19->left_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_318[1].type);
  BindNode((Binder *)local_1f8,(QueryNode *)pBVar21);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  uVar15 = local_1f8._0_8_;
  local_1f8._0_8_ = (element_type *)0x0;
  _Var4._M_head_impl =
       (pBVar19->left).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar19->left).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar15;
  if ((_Var4._M_head_impl != (BoundQueryNode *)0x0) &&
     ((**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundQueryNode + 8))(),
     (element_type *)local_1f8._0_8_ != (element_type *)0x0)) {
    (**(code **)(*(long *)local_1f8._0_8_ + 8))();
  }
  CreateBinder((Binder *)local_1f8,(local_358.ptr)->context,local_358,REGULAR_BINDER);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  uVar16 = local_1f8._8_8_;
  uVar15 = local_1f8._0_8_;
  local_1f8._0_8_ = (element_type *)0x0;
  local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (pBVar19->right_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar19->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar15;
  (pBVar19->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar16;
  if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar21 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar19->right_binder);
  pBVar21->can_contain_nulls = true;
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar21 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar19->right_binder);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_318[1].modifiers);
  BindNode((Binder *)local_1f8,(QueryNode *)pBVar21);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  uVar15 = local_1f8._0_8_;
  local_1f8._0_8_ = (element_type *)0x0;
  _Var4._M_head_impl =
       (pBVar19->right).
       super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  (pBVar19->right).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = (BoundQueryNode *)uVar15;
  if ((_Var4._M_head_impl != (BoundQueryNode *)0x0) &&
     ((**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundQueryNode + 8))(),
     (element_type *)local_1f8._0_8_ != (element_type *)0x0)) {
    (**(code **)(*(long *)local_1f8._0_8_ + 8))();
  }
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->(&pBVar19->left);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar19->super_BoundQueryNode).names,
              &(pBVar22->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar23 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar19->left_binder);
  MoveCorrelatedExpressions(local_358.ptr,pBVar23);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar23 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar19->right_binder);
  MoveCorrelatedExpressions(local_358.ptr,pBVar23);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  if (pBVar19->setop_type != UNION_BY_NAME) {
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar19->left);
    pLVar5 = (pBVar22->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar6 = (pBVar22->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar19->right);
    if ((long)pLVar5 - (long)pLVar6 !=
        (long)(pBVar22->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pBVar22->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) {
      pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1f8._0_8_ = local_1e8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "Set operations can only apply to expressions with the same number of result columns"
                 ,"");
      BinderException::BinderException(pBVar37,(string *)local_1f8);
      __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  if (pBVar19->setop_type == UNION_BY_NAME) {
    pBVar24 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_360);
    local_320 = CONCAT71(local_320._1_7_,(local_358.ptr)->can_contain_nulls);
    local_248._M_buckets = &local_248._M_single_bucket;
    local_248._M_bucket_count = (size_type)&DAT_00000001;
    local_248._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_248._M_element_count = 0;
    local_248._M_rehash_policy._M_max_load_factor = 1.0;
    local_248._M_rehash_policy._M_next_resize = 0;
    local_248._M_single_bucket = (__node_base_ptr)0x0;
    local_68._0_8_ = &oStack_38;
    local_68._8_8_ = 1;
    local_68._16_8_ = 0;
    aStack_50._M_allocated_capacity = 0;
    aStack_50._8_4_ = 1.0;
    local_40._M_p = (pointer)0x0;
    oStack_38.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
    local_338 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar24->left);
    local_340 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar24->right);
    pbVar28 = (local_338->names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar39 = pbVar28;
    if (pbVar28 !=
        (local_338->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = &local_338->names;
      sVar41 = 0;
      do {
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar26 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_248,pvVar25);
        if (iVar26.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8._0_8_ = local_1e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,
                     "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the left-hand side"
                     ,"");
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          local_2f8._0_8_ = local_2f8 + 0x10;
          pcVar10 = (pvVar25->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,pcVar10,pcVar10 + pvVar25->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar37,(string *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
          ;
          __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        pmVar27 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&local_248,pvVar25);
        *pmVar27 = sVar41;
        sVar41 = sVar41 + 1;
        pbVar28 = (local_338->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar39 = (local_338->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (sVar41 < (ulong)((long)pbVar39 - (long)pbVar28 >> 5));
    }
    local_328 = pBVar24;
    if ((local_340->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_340->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = &local_340->names;
      sVar41 = 0;
      do {
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar26 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_68,pvVar25);
        if (iVar26.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8._0_8_ = local_1e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,
                     "UNION (ALL) BY NAME operation doesn\'t support duplicate names in the SELECT list - the name \"%s\" occurs multiple times in the right-hand side"
                     ,"");
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          local_2f8._0_8_ = local_2f8 + 0x10;
          pcVar10 = (pvVar25->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,pcVar10,pcVar10 + pvVar25->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar37,(string *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
          ;
          __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        iVar26 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_248,pvVar25);
        if (iVar26.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](pvVar1,sVar41);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(pBVar24->super_BoundQueryNode).names,pvVar25);
        }
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](pvVar1,sVar41);
        pmVar27 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_68,pvVar25);
        *pmVar27 = sVar41;
        sVar41 = sVar41 + 1;
      } while (sVar41 < (ulong)((long)(local_340->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_340->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
      pbVar28 = (local_338->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar39 = (local_338->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    pbVar7 = (local_328->super_BoundQueryNode).names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = (local_328->super_BoundQueryNode).names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_278,(long)pbVar39 - (long)pbVar28 >> 5,(allocator_type *)local_1f8);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_298,
               (long)(local_340->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_340->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1f8);
    local_300 = &(local_328->super_BoundQueryNode).names;
    local_2a8 = (long)pbVar8 - (long)pbVar7 >> 5;
    local_208 = pbVar8;
    local_200 = pbVar7;
    if (pbVar8 == pbVar7) {
      local_330 = (vector<duckdb::LogicalType,_true> *)((ulong)local_330._4_4_ << 0x20);
    }
    else {
      local_310 = &local_338->types;
      pvVar38 = &local_340->types;
      local_2a0 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  &(local_328->super_BoundQueryNode).types;
      local_308 = (vector<duckdb::LogicalType,_true> *)(local_2a8 + (local_2a8 == 0));
      __n_00 = (undefined1 *)0x0;
      local_330 = (vector<duckdb::LogicalType,_true> *)((ulong)local_330._4_4_ << 0x20);
      local_250 = pvVar38;
      do {
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_300,(size_type)__n_00);
        iVar26 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_248,pvVar25);
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_300,(size_type)__n_00);
        _Var29._M_cur =
             (__node_type *)
             ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_68,pvVar25);
        LogicalType::LogicalType((LogicalType *)local_1f8);
        pvVar38 = (vector<duckdb::LogicalType,_true> *)((ulong)pvVar38 & 0xffffffffffffff00);
        if (_Var29._M_cur == (__node_type *)0x0 ||
            iVar26.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (iVar26.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_250,*(size_type *)((long)_Var29._M_cur + 0x28));
            this_00 = &local_298;
          }
          else {
            pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_310,
                                 *(size_type *)
                                  ((long)iVar26.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            this_00 = &local_278;
            _Var29 = iVar26.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                     ._M_cur;
          }
          uVar15 = local_1f8._0_8_;
          if ((LogicalType *)local_1f8 != pvVar30) {
            uVar11 = pvVar30->id_;
            uVar12 = pvVar30->physical_type_;
            local_1f8[1] = uVar12;
            local_1f8[0] = uVar11;
            pvVar38 = (vector<duckdb::LogicalType,_true> *)((ulong)pvVar38 & 0xffffffffffffff00);
            local_1f8._2_6_ = SUB86(uVar15,2);
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_1f8 + 8),
                       &pvVar30->type_info_);
          }
          pvVar32 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)this_00,
                               *(size_type *)
                                ((long)&((_Var29._M_cur)->
                                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                        ._M_storage._M_storage + 0x20));
          pvVar38 = (vector<duckdb::LogicalType,_true> *)CONCAT71((int7)((ulong)pvVar38 >> 8),1);
          local_330 = (vector<duckdb::LogicalType,_true> *)CONCAT44(local_330._4_4_,(int)pvVar38);
        }
        else {
          pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_310,
                               *(size_type *)
                                ((long)iVar26.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          pvVar31 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_250,*(size_type *)((long)_Var29._M_cur + 0x28));
          LogicalType::ForceMaxLogicalType((LogicalType *)local_2f8,pvVar30,pvVar31);
          uVar16 = local_1e8._0_8_;
          uVar15 = local_1f8._8_8_;
          local_1f8._0_2_ = local_2f8._0_2_;
          local_1f8._8_8_ = local_2f8._8_8_;
          local_1e8._0_8_ = local_2f8._16_8_;
          local_2f8._8_8_ = uVar15;
          local_2f8._16_8_ = uVar16;
          LogicalType::~LogicalType((LogicalType *)local_2f8);
          if ((__n_00 != *(undefined1 **)
                          ((long)iVar26.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28)) ||
             (__n_00 != *(undefined1 **)((long)_Var29._M_cur + 0x28))) {
            local_330 = (vector<duckdb::LogicalType,_true> *)
                        CONCAT44(local_330._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
          }
          pvVar32 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)&local_278,
                               (size_type)
                               *(undefined1 **)
                                ((long)iVar26.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          *pvVar32 = (value_type)__n_00;
          pvVar32 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)&local_298,
                               *(size_type *)((long)_Var29._M_cur + 0x28));
        }
        *pvVar32 = (value_type)__n_00;
        if (((char)local_320 == '\0') &&
           (bVar17 = ExpressionBinder::ContainsNullType((LogicalType *)local_1f8), bVar17)) {
          ExpressionBinder::ExchangeNullType((LogicalType *)local_2f8,(LogicalType *)local_1f8);
          uVar16 = local_1e8._0_8_;
          uVar15 = local_1f8._8_8_;
          local_1f8._0_2_ = local_2f8._0_2_;
          local_1f8._8_8_ = local_2f8._8_8_;
          local_1e8._0_8_ = local_2f8._16_8_;
          local_2f8._8_8_ = uVar15;
          local_2f8._16_8_ = uVar16;
          LogicalType::~LogicalType((LogicalType *)local_2f8);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (local_2a0,(LogicalType *)local_1f8);
        LogicalType::~LogicalType((LogicalType *)local_1f8);
        __n_00 = __n_00 + 1;
      } while (local_308 != (vector<duckdb::LogicalType,_true> *)__n_00);
    }
    pBVar24 = local_328;
    puVar9 = (local_328->left_reorder_idx).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_328->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_328->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_328->left_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar9 != (pointer)0x0) {
      operator_delete(puVar9);
    }
    puVar9 = (pBVar24->right_reorder_idx).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pBVar24->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pBVar24->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (pBVar24->right_reorder_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar9 != (pointer)0x0) {
      operator_delete(puVar9);
    }
    if (((byte)local_330 & local_208 != local_200) == 1) {
      local_308 = &local_338->types;
      local_330 = &local_340->types;
      local_310 = &(local_328->super_BoundQueryNode).types;
      local_2a0 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  &local_328->left_reorder_exprs;
      local_328 = (type)&local_328->right_reorder_exprs;
      local_2a8 = local_2a8 + (local_2a8 == 0);
      sVar41 = 0;
      do {
        local_320 = sVar41;
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_300,sVar41);
        iVar26 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_248,pvVar25);
        pvVar25 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](local_300,local_320);
        iVar33 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_68,pvVar25);
        local_348._M_head_impl = (Expression *)0x0;
        local_350._M_head_impl = (Expression *)0x0;
        if (iVar33.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0 ||
            iVar26.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (iVar26.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            pvVar30 = vector<duckdb::LogicalType,_true>::operator[](local_310,local_320);
            LogicalType::LogicalType(&local_98,pvVar30);
            Value::Value((Value *)local_2f8,&local_98);
            _Var34._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_1f8,(Value *)local_2f8);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var34._M_head_impl,(Value *)local_1f8);
            Value::~Value((Value *)local_1f8);
            if (local_348._M_head_impl != (Expression *)0x0) {
              pBVar13 = &(local_348._M_head_impl)->super_BaseExpression;
              local_348._M_head_impl = _Var34._M_head_impl;
              (*pBVar13->_vptr_BaseExpression[1])();
              _Var34._M_head_impl = local_348._M_head_impl;
            }
            local_348._M_head_impl = _Var34._M_head_impl;
            Value::~Value((Value *)local_2f8);
            LogicalType::~LogicalType(&local_98);
            pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                                (local_330,
                                 *(size_type *)
                                  ((long)iVar33.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28));
            iVar18 = (*local_340->_vptr_BoundQueryNode[2])();
            binding_02.table_index._4_4_ = extraout_var_02;
            binding_02.table_index._0_4_ = iVar18;
            iVar20 = *(idx_t *)((long)iVar33.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                      ._M_cur + 0x28);
            _Var34._M_head_impl = (Expression *)operator_new(0x70);
            LogicalType::LogicalType((LogicalType *)local_1f8,pvVar30);
            binding_02.column_index = iVar20;
            BoundColumnRefExpression::BoundColumnRefExpression
                      ((BoundColumnRefExpression *)_Var34._M_head_impl,(LogicalType *)local_1f8,
                       binding_02,0);
            goto LAB_00d93b88;
          }
          pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_308,
                               *(size_type *)
                                ((long)iVar26.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar18 = (*local_338->_vptr_BoundQueryNode[2])();
          binding.table_index._4_4_ = extraout_var;
          binding.table_index._0_4_ = iVar18;
          iVar20 = *(idx_t *)((long)iVar26.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var34._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_1f8,pvVar30);
          binding.column_index = iVar20;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var34._M_head_impl,(LogicalType *)local_1f8,
                     binding,0);
          LogicalType::~LogicalType((LogicalType *)local_1f8);
          if (local_348._M_head_impl != (Expression *)0x0) {
            pBVar13 = &(local_348._M_head_impl)->super_BaseExpression;
            local_348._M_head_impl = _Var34._M_head_impl;
            (*pBVar13->_vptr_BaseExpression[1])();
            _Var34._M_head_impl = local_348._M_head_impl;
          }
          local_348._M_head_impl = _Var34._M_head_impl;
          pvVar30 = vector<duckdb::LogicalType,_true>::operator[](local_310,local_320);
          LogicalType::LogicalType(&local_80,pvVar30);
          Value::Value((Value *)local_2f8,&local_80);
          _Var34._M_head_impl = (Expression *)operator_new(0x98);
          Value::Value((Value *)local_1f8,(Value *)local_2f8);
          BoundConstantExpression::BoundConstantExpression
                    ((BoundConstantExpression *)_Var34._M_head_impl,(Value *)local_1f8);
          Value::~Value((Value *)local_1f8);
          if (local_350._M_head_impl != (Expression *)0x0) {
            pBVar13 = &(local_350._M_head_impl)->super_BaseExpression;
            local_350._M_head_impl = _Var34._M_head_impl;
            (*pBVar13->_vptr_BaseExpression[1])();
            _Var34._M_head_impl = local_350._M_head_impl;
          }
          local_350._M_head_impl = _Var34._M_head_impl;
          Value::~Value((Value *)local_2f8);
          LogicalType::~LogicalType(&local_80);
          _Var34._M_head_impl = local_350._M_head_impl;
        }
        else {
          pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_308,
                               *(size_type *)
                                ((long)iVar26.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar18 = (*local_338->_vptr_BoundQueryNode[2])();
          binding_00.table_index._4_4_ = extraout_var_00;
          binding_00.table_index._0_4_ = iVar18;
          iVar20 = *(idx_t *)((long)iVar26.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var34._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_1f8,pvVar30);
          binding_00.column_index = iVar20;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var34._M_head_impl,(LogicalType *)local_1f8,
                     binding_00,0);
          LogicalType::~LogicalType((LogicalType *)local_1f8);
          if (local_348._M_head_impl != (Expression *)0x0) {
            pBVar13 = &(local_348._M_head_impl)->super_BaseExpression;
            local_348._M_head_impl = _Var34._M_head_impl;
            (*pBVar13->_vptr_BaseExpression[1])();
            _Var34._M_head_impl = local_348._M_head_impl;
          }
          local_348._M_head_impl = _Var34._M_head_impl;
          pvVar30 = vector<duckdb::LogicalType,_true>::operator[]
                              (local_330,
                               *(size_type *)
                                ((long)iVar33.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
          iVar18 = (*local_340->_vptr_BoundQueryNode[2])();
          binding_01.table_index._4_4_ = extraout_var_01;
          binding_01.table_index._0_4_ = iVar18;
          iVar20 = *(idx_t *)((long)iVar33.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          _Var34._M_head_impl = (Expression *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_1f8,pvVar30);
          binding_01.column_index = iVar20;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)_Var34._M_head_impl,(LogicalType *)local_1f8,
                     binding_01,0);
LAB_00d93b88:
          LogicalType::~LogicalType((LogicalType *)local_1f8);
          if (local_350._M_head_impl != (Expression *)0x0) {
            pBVar13 = &(local_350._M_head_impl)->super_BaseExpression;
            local_350._M_head_impl = _Var34._M_head_impl;
            (*pBVar13->_vptr_BaseExpression[1])();
            _Var34._M_head_impl = local_350._M_head_impl;
          }
        }
        local_350._M_head_impl = _Var34._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_2a0,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_348);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_328,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_350);
        if ((BoundConstantExpression *)local_350._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_350._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        if ((BoundConstantExpression *)local_348._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((Expression *)&(local_348._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        sVar41 = local_320 + 1;
      } while (local_2a8 != sVar41);
    }
    if (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_68);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_248);
  }
  else {
    __n = 0;
    while( true ) {
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->left);
      if ((ulong)(((long)(pBVar22->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar22->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          __n) break;
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->left);
      pvVar30 = vector<duckdb::LogicalType,_true>::operator[](&pBVar22->types,__n);
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      pBVar22 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->right);
      pvVar31 = vector<duckdb::LogicalType,_true>::operator[](&pBVar22->types,__n);
      LogicalType::ForceMaxLogicalType((LogicalType *)local_1f8,pvVar30,pvVar31);
      if (((local_358.ptr)->can_contain_nulls == false) &&
         (bVar17 = ExpressionBinder::ContainsNullType((LogicalType *)local_1f8), bVar17)) {
        ExpressionBinder::ExchangeNullType((LogicalType *)local_2f8,(LogicalType *)local_1f8);
        uVar16 = local_1e8._0_8_;
        uVar15 = local_1f8._8_8_;
        local_1f8._0_2_ = local_2f8._0_2_;
        local_1f8._8_8_ = local_2f8._8_8_;
        local_1e8._0_8_ = local_2f8._16_8_;
        local_2f8._8_8_ = uVar15;
        local_2f8._16_8_ = uVar16;
        LogicalType::~LogicalType((LogicalType *)local_2f8);
      }
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &(pBVar19->super_BoundQueryNode).types,(LogicalType *)local_1f8);
      LogicalType::~LogicalType((LogicalType *)local_1f8);
      __n = __n + 1;
    }
  }
  local_1f8._0_8_ = auStack_1c8;
  local_1f8._8_8_ = &DAT_00000001;
  local_1e8._0_8_ = (ClientContext *)0x0;
  local_1e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8._16_4_ = 0x3f800000;
  local_1e8._24_8_ = (_Hash_node_base *)0x0;
  auStack_1c8._0_8_ = (element_type *)0x0;
  auStack_1c8._8_8_ = auStack_190;
  local_1b8 = (ClientContext *)&DAT_00000001;
  local_1b0._M_nxt = (__node_base_ptr)0x0;
  pp_Stack_1a8 = (__buckets_ptr)0x0;
  local_1a0 = 1.0;
  local_170._M_buckets = &local_170._M_single_bucket;
  local_198._M_nxt = (_Hash_node_base *)0x0;
  auStack_190 = (undefined1  [8])0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._M_bucket_count = (size_type)&DAT_00000001;
  local_170._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_170._M_element_count = 0;
  local_170._M_rehash_policy._M_max_load_factor = 1.0;
  local_170._M_rehash_policy._M_next_resize = 0;
  local_170._M_single_bucket = (__node_base_ptr)0x0;
  local_138._0_8_ = local_138 + 0x30;
  local_138._8_8_ = &DAT_00000001;
  local_138._16_8_ = (_Hash_node_base *)0x0;
  local_138._24_8_ = (pointer)0x0;
  local_138._32_4_ = 1.0;
  local_138._40_8_ = (__node_base_ptr)0x0;
  local_138._48_8_ = (_Hash_node_base *)0x0;
  local_100._M_buckets = &local_100._M_single_bucket;
  local_100._M_bucket_count = (size_type)&DAT_00000001;
  local_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_100._M_element_count = 0;
  local_100._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_nxt = (_Hash_node_base *)0x0;
  local_c8 = (pointer)0x0;
  puStack_c0 = (pointer)0x0;
  local_100._M_rehash_policy._M_next_resize = 0;
  local_100._M_single_bucket = (__node_base_ptr)0x0;
  if ((local_318->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_318->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    if (pBVar19->setop_type == UNION_BY_NAME) {
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      pBVar35 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar19->left);
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      GatherAliases(pBVar35,(SelectBindState *)local_1f8,&pBVar19->left_reorder_idx);
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      pBVar35 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator*(&pBVar19->right);
      pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                              *)&local_360);
      GatherAliases(pBVar35,(SelectBindState *)local_1f8,&pBVar19->right_reorder_idx);
    }
    else {
      local_2f8._0_8_ = (pointer)0x0;
      local_2f8._8_8_ = (element_type *)0x0;
      local_2f8._16_8_ = (ClientContext *)0x0;
      pp_Var40 = (__buckets_ptr)0x0;
      while (local_248._M_buckets = pp_Var40,
            pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                                    *)&local_360),
            pp_Var40 <
            (__buckets_ptr)
            ((long)(pBVar19->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar19->super_BoundQueryNode).names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        if (local_2f8._8_8_ == local_2f8._16_8_) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_2f8,
                     (iterator)local_2f8._8_8_,(unsigned_long *)&local_248);
        }
        else {
          *(__buckets_ptr *)local_2f8._8_8_ = local_248._M_buckets;
          local_2f8._8_8_ = local_2f8._8_8_ + 8;
        }
        pp_Var40 = (__buckets_ptr)((long)local_248._M_buckets + 1);
      }
      pBVar24 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                             *)&local_360);
      GatherAliases(&pBVar24->super_BoundQueryNode,(SelectBindState *)local_1f8,
                    (vector<unsigned_long,_true> *)local_2f8);
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2f8._0_8_);
      }
    }
    local_248._M_buckets = (__node_base_ptr *)0x0;
    local_248._M_bucket_count = 0;
    local_248._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar35 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar19->left);
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar23 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar19->left_binder);
    GatherSetOpBinders(pBVar35,pBVar23,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_248);
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar35 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar19->right);
    pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)&local_360);
    pBVar23 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar19->right_binder);
    GatherSetOpBinders(pBVar35,pBVar23,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_248);
    ::std::
    vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ::vector(&local_b0,
             (vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              *)&local_248);
    OrderBinder::OrderBinder
              ((OrderBinder *)local_2f8,
               (vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_b0,
               (SelectBindState *)local_1f8);
    if (local_b0.
        super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pBVar24 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)&local_360);
    PrepareModifiers(local_358.ptr,(OrderBinder *)local_2f8,local_318,&pBVar24->super_BoundQueryNode
                    );
    if ((undefined1 *)local_2f8._40_8_ != local_2c0) {
      operator_delete((void *)local_2f8._40_8_);
    }
    if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2f8._0_8_);
    }
    if (local_248._M_buckets != (__node_base_ptr *)0x0) {
      operator_delete(local_248._M_buckets);
    }
  }
  pBVar24 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)&local_360);
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  iVar20 = pBVar19->setop_index;
  pBVar19 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  pBVar36 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                          *)&local_360);
  BindModifiers(local_358.ptr,&pBVar24->super_BoundQueryNode,iVar20,
                &(pBVar19->super_BoundQueryNode).names,&(pBVar36->super_BoundQueryNode).types,
                (SelectBindState *)local_1f8);
  _Var14._M_head_impl = local_360._M_head_impl;
  local_360._M_head_impl = (BoundSetOperationNode *)0x0;
  (((enable_shared_from_this<duckdb::Binder> *)
   local_258._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
   super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl)->__weak_this_).internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var14._M_head_impl;
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_100);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_138);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_170);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_188);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_1c8 + 8));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1f8);
  if (local_360._M_head_impl != (BoundSetOperationNode *)0x0) {
    (*((local_360._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode[1])();
  }
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
         local_258._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindNode(SetOperationNode &statement) {
	auto result = make_uniq<BoundSetOperationNode>();
	result->setop_type = statement.setop_type;
	result->setop_all = statement.setop_all;

	// first recursively visit the set operations
	// both the left and right sides have an independent BindContext and Binder
	D_ASSERT(statement.left);
	D_ASSERT(statement.right);

	result->setop_index = GenerateTableIndex();

	result->left_binder = Binder::CreateBinder(context, this);
	result->left_binder->can_contain_nulls = true;
	result->left = result->left_binder->BindNode(*statement.left);
	result->right_binder = Binder::CreateBinder(context, this);
	result->right_binder->can_contain_nulls = true;
	result->right = result->right_binder->BindNode(*statement.right);

	result->names = result->left->names;

	// move the correlated expressions from the child binders to this binder
	MoveCorrelatedExpressions(*result->left_binder);
	MoveCorrelatedExpressions(*result->right_binder);

	// now both sides have been bound we can resolve types
	if (result->setop_type != SetOperationType::UNION_BY_NAME &&
	    result->left->types.size() != result->right->types.size()) {
		throw BinderException("Set operations can only apply to expressions with the "
		                      "same number of result columns");
	}

	if (result->setop_type == SetOperationType::UNION_BY_NAME) {
		BuildUnionByNameInfo(context, *result, can_contain_nulls);
	} else {
		// figure out the types of the setop result by picking the max of both
		for (idx_t i = 0; i < result->left->types.size(); i++) {
			auto result_type = LogicalType::ForceMaxLogicalType(result->left->types[i], result->right->types[i]);
			if (!can_contain_nulls) {
				if (ExpressionBinder::ContainsNullType(result_type)) {
					result_type = ExpressionBinder::ExchangeNullType(result_type);
				}
			}
			result->types.push_back(result_type);
		}
	}

	SelectBindState bind_state;
	if (!statement.modifiers.empty()) {
		// handle the ORDER BY/DISTINCT clauses

		// we recursively visit the children of this node to extract aliases and expressions that can be referenced
		// in the ORDER BY

		if (result->setop_type == SetOperationType::UNION_BY_NAME) {
			GatherAliases(*result->left, bind_state, result->left_reorder_idx);
			GatherAliases(*result->right, bind_state, result->right_reorder_idx);
		} else {
			vector<idx_t> reorder_idx;
			for (idx_t i = 0; i < result->names.size(); i++) {
				reorder_idx.push_back(i);
			}
			GatherAliases(*result, bind_state, reorder_idx);
		}
		// now we perform the actual resolution of the ORDER BY/DISTINCT expressions
		vector<reference<Binder>> binders;
		GatherSetOpBinders(*result->left, *result->left_binder, binders);
		GatherSetOpBinders(*result->right, *result->right_binder, binders);
		OrderBinder order_binder(binders, bind_state);
		PrepareModifiers(order_binder, statement, *result);
	}

	// finally bind the types of the ORDER/DISTINCT clause expressions
	BindModifiers(*result, result->setop_index, result->names, result->types, bind_state);
	return std::move(result);
}